

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O0

string * __thiscall pbrt::syntactic::Loc::toString_abi_cxx11_(Loc *this)

{
  __shared_ptr *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  File *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_108 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff2c;
  bool local_b2;
  allocator<char> local_b1;
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  __lhs = in_RDI;
  local_b2 = std::__shared_ptr::operator_cast_to_bool(in_RSI);
  if (local_b2) {
    std::__shared_ptr_access<pbrt::syntactic::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<pbrt::syntactic::File,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x17e27b);
    File::getFileName_abi_cxx11_(in_stack_fffffffffffffed8);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18,
               (allocator<char> *)in_stack_ffffffffffffff10);
  }
  local_b2 = !local_b2;
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::to_string(in_stack_ffffffffffffff2c);
  std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::to_string(in_stack_ffffffffffffff2c);
  std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_b0);
  if (local_b2) {
    std::allocator<char>::~allocator(&local_b1);
  }
  return __lhs;
}

Assistant:

std::string toString() const {
        return "@" + (file?file->getFileName():"<invalid>") + ":" + std::to_string(line) + "." + std::to_string(col);
      }